

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9TokenizeInput(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)

{
  SySet *pSVar1;
  uint uVar2;
  sxi32 sVar3;
  sxu32 sVar4;
  ushort **ppuVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  jx9_expr_op *pjVar9;
  ulong uVar10;
  int iVar11;
  byte bVar12;
  long lVar13;
  byte *pbVar14;
  SyToken *pLast;
  char *zSrc;
  uint uVar15;
  uint uVar16;
  byte *pbVar17;
  bool bVar18;
  
  pbVar17 = pStream->zText;
  pbVar7 = pStream->zEnd;
  bVar18 = pbVar17 < pbVar7;
  if (!bVar18) {
    return -0x12;
  }
  bVar12 = *pbVar17;
  if (bVar12 < 0xc0) {
    ppuVar5 = __ctype_b_loc();
    pbVar17 = pbVar17 + 1;
    do {
      if ((*(byte *)((long)*ppuVar5 + (ulong)bVar12 * 2 + 1) & 0x20) == 0) break;
      if (bVar12 == 10) {
        pStream->nLine = pStream->nLine + 1;
      }
      pStream->zText = pbVar17;
      bVar18 = pbVar17 < pbVar7;
      if (pbVar17 == pbVar7) {
        return -0x12;
      }
      bVar12 = *pbVar17;
      pbVar17 = pbVar17 + 1;
    } while (bVar12 < 0xc0);
    pbVar17 = pbVar17 + -1;
  }
  if (!bVar18) {
    return -0x12;
  }
  pToken->nLine = pStream->nLine;
  pToken->pUserData = (void *)0x0;
  (pToken->sData).zString = (char *)pbVar17;
  (pToken->sData).nByte = 0;
  bVar12 = *pbVar17;
  uVar10 = (ulong)bVar12;
  if (((0xbf < uVar10) || (ppuVar5 = __ctype_b_loc(), uVar10 == 0x5f)) ||
     (((*ppuVar5)[uVar10] & 0x400) != 0)) {
    if (bVar12 < 0xc0) {
      pStream->zText = pbVar17 + 1;
    }
    pbVar8 = pStream->zText;
    do {
      pbVar6 = pbVar8;
      if (0xbf < *pbVar8) {
        pbVar6 = pbVar8 + 1;
      }
      pbVar14 = pbVar6;
      if (pbVar6 < pbVar7) {
        lVar13 = (long)pbVar7 - (long)pbVar6;
        do {
          uVar10 = (ulong)*pbVar6;
          pbVar14 = pbVar6;
          if ((0xbf < uVar10) ||
             ((ppuVar5 = __ctype_b_loc(), uVar10 != 0x5f && (((*ppuVar5)[uVar10] & 8) == 0))))
          break;
          pbVar6 = pbVar6 + 1;
          lVar13 = lVar13 + -1;
          pbVar14 = pbVar7;
        } while (lVar13 != 0);
      }
      if (pbVar14 == pbVar8) goto LAB_001247a1;
      pStream->zText = pbVar14;
      pbVar8 = pbVar14;
    } while( true );
  }
  if (uVar10 == 0x23) {
LAB_001248be:
    do {
      pbVar17 = pbVar17 + 1;
      pStream->zText = pbVar17;
      if (pbVar7 <= pbVar17) break;
    } while (*pbVar17 != 10);
LAB_001248d1:
    sVar3 = -0x19;
    bVar18 = false;
    goto LAB_00125010;
  }
  if (bVar12 == 0x2f) {
    pbVar8 = pbVar17 + 1;
    if ((pbVar8 < pbVar7) && (*pbVar8 == 0x2f)) goto LAB_001248be;
    if ((pbVar7 <= pbVar8) || (*pbVar8 != 0x2a)) goto LAB_00124978;
    pbVar8 = pbVar17 + 2;
    pStream->zText = pbVar8;
    pbVar6 = pbVar8;
    if (pbVar8 < pbVar7) {
      pbVar17 = pbVar17 + 3;
      do {
        if (pbVar17[-1] == 10) {
          pStream->nLine = pStream->nLine + 1;
        }
        else if (pbVar17[-1] == 0x2a) {
          if (pbVar7 <= pbVar17) {
            pbVar6 = pbVar17 + -1;
            break;
          }
          pbVar6 = pbVar8;
          if (*pbVar17 == 0x2f) break;
        }
        pbVar8 = pbVar8 + 1;
        pStream->zText = pbVar17;
        bVar18 = pbVar17 < pbVar7;
        pbVar6 = pbVar17;
        pbVar17 = pbVar17 + 1;
      } while (bVar18);
    }
    pStream->zText = pbVar6 + 2;
    goto LAB_001248d1;
  }
LAB_00124978:
  if (((*ppuVar5)[uVar10] >> 0xb & 1) != 0) {
    pbVar8 = pbVar17 + 3;
    do {
      pbVar14 = pbVar8;
      pbVar6 = pbVar14 + -2;
      pStream->zText = pbVar6;
      if ((pbVar7 <= pbVar6) || (0xbf < (ulong)*pbVar6)) break;
      pbVar8 = pbVar14 + 1;
    } while ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar6 * 2 + 1) & 8) != 0);
    pToken->nType = 1;
    if (pbVar6 < pbVar7) {
      pbVar8 = pbVar14 + -1;
      if (pbVar14[-2] == 0x2e) {
        do {
          pbVar6 = pbVar8;
          pStream->zText = pbVar6;
          if (pbVar7 <= pbVar6) goto LAB_00124c11;
        } while (((ulong)*pbVar6 < 0xc0) &&
                (pbVar8 = pbVar6 + 1, (*(byte *)((long)*ppuVar5 + (ulong)*pbVar6 * 2 + 1) & 8) != 0)
                );
        if ((pbVar6 < pbVar7) && ((*pbVar6 & 0xdf) == 0x45)) {
          pbVar8 = pbVar6 + 1;
          pStream->zText = pbVar8;
          if (pbVar8 < pbVar7) {
            if ((((*pbVar8 == 0x2d) || (*pbVar8 == 0x2b)) && (pbVar6 = pbVar6 + 2, pbVar6 < pbVar7))
               && (((ulong)*pbVar6 < 0xc0 &&
                   ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar6 * 2 + 1) & 8) != 0)))) {
              pStream->zText = pbVar6;
            }
            pbVar8 = pStream->zText;
            if (pbVar8 < pbVar7) {
              do {
                if ((0xbf < (ulong)*pbVar8) ||
                   ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar8 * 2 + 1) & 8) == 0)) break;
                pbVar8 = pbVar8 + 1;
                pStream->zText = pbVar8;
              } while (pbVar8 != pbVar7);
            }
          }
        }
LAB_00124c11:
        pToken->nType = 2;
      }
      else {
        bVar12 = pbVar14[-2] & 0xdf;
        if (bVar12 == 0x58) {
          do {
            pStream->zText = pbVar8;
            if ((pbVar7 <= pbVar8) || (bVar12 = *pbVar8, 0xbf < (ulong)bVar12)) break;
            pbVar8 = pbVar8 + 1;
          } while ((*(byte *)((long)*ppuVar5 + (ulong)bVar12 * 2 + 1) & 0x10) != 0);
        }
        else {
          if (bVar12 == 0x45) {
            pbVar8 = pbVar14 + -1;
            pStream->zText = pbVar8;
            if (pbVar8 < pbVar7) {
              if ((((*pbVar8 == 0x2d) || (*pbVar8 == 0x2b)) && (pbVar14 < pbVar7)) &&
                 (((ulong)*pbVar14 < 0xc0 &&
                  ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar14 * 2 + 1) & 8) != 0)))) {
                pStream->zText = pbVar14;
              }
              pbVar8 = pStream->zText;
              if (pbVar8 < pbVar7) {
                do {
                  if ((0xbf < (ulong)*pbVar8) ||
                     ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar8 * 2 + 1) & 8) == 0)) break;
                  pbVar8 = pbVar8 + 1;
                  pStream->zText = pbVar8;
                } while (pbVar8 != pbVar7);
              }
            }
            goto LAB_00124c11;
          }
          if (bVar12 == 0x42) {
            do {
              pStream->zText = pbVar8;
              if (pbVar7 <= pbVar8) break;
              bVar12 = *pbVar8;
              pbVar8 = pbVar8 + 1;
            } while ((bVar12 & 0xfe) == 0x30);
          }
        }
      }
    }
    (pToken->sData).nByte = *(int *)&pStream->zText - (int)pbVar17;
    goto LAB_00124c22;
  }
  pbVar8 = pbVar17 + 1;
  pStream->zText = pbVar8;
  pToken->nType = 0x20;
  if (0x5a < bVar12) {
    if (bVar12 < 0x7b) {
      if (bVar12 == 0x5b) {
        pToken->nType = 0x820;
      }
      else if (bVar12 == 0x5d) {
        pToken->nType = 0x1000;
      }
      else if (bVar12 == 0x5e) goto switchD_001249b3_caseD_25;
    }
    else if (bVar12 == 0x7b) {
      pToken->nType = 0x40;
    }
    else if (bVar12 == 0x7c) {
      if ((pbVar8 < pbVar7) && ((*pbVar8 == 0x3d || (*pbVar8 == 0x7c)))) goto LAB_00124b14;
    }
    else if (bVar12 == 0x7d) {
      pToken->nType = 0x80;
    }
    goto switchD_001249b3_caseD_23;
  }
  switch(bVar12) {
  case 0x21:
    if ((pbVar8 < pbVar7) && (*pbVar8 == 0x3d)) {
LAB_00124c69:
      pbVar8 = pbVar17 + 2;
      pStream->zText = pbVar8;
      if ((pbVar8 < pbVar7) && (*pbVar8 == 0x3d)) {
LAB_00124c83:
        pbVar17 = pbVar17 + 3;
        goto LAB_00124b18;
      }
    }
    break;
  case 0x22:
    (pToken->sData).zString = (char *)pbVar8;
    pbVar17 = pStream->zText;
    while (pbVar17 < pbVar7) {
      if (((*pbVar17 == 0x7b) && (pbVar6 = pbVar17 + 1, pbVar6 < pbVar7)) && (*pbVar6 == 0x24)) {
        pStream->zText = pbVar6;
        if (pbVar6 < pbVar7) {
          pbVar17 = pbVar7 + (-1 - (long)pbVar17);
          iVar11 = 1;
          do {
            bVar12 = *pbVar6;
            if (bVar12 == 10) {
              pStream->nLine = pStream->nLine + 1;
            }
            else if (bVar12 == 0x7d) {
              if (iVar11 < 2) {
                pStream->zText = pbVar6 + 1;
                pbVar6 = pbVar6 + 1;
                break;
              }
              iVar11 = iVar11 + -1;
            }
            else if (bVar12 == 0x7b) {
              iVar11 = iVar11 + 1;
            }
            pbVar6 = pbVar6 + 1;
            pStream->zText = pbVar6;
            pbVar17 = pbVar17 + -1;
          } while (pbVar17 != (byte *)0x0);
        }
        pbVar17 = pbVar6;
        if (pbVar7 <= pbVar17) break;
      }
      if (*pbVar17 == 10) {
        pStream->nLine = pStream->nLine + 1;
      }
      else if (*pbVar17 == 0x22) {
        if (pbVar17[-1] != 0x5c) break;
        pbVar6 = pbVar17 + -2;
        pbVar14 = pStream->zInput;
        if (pbVar14 < pbVar6) {
          uVar16 = 1;
          do {
            uVar15 = uVar16;
            if (*pbVar6 != 0x5c) break;
            pbVar6 = pbVar6 + -1;
            uVar16 = uVar16 + 1;
            uVar15 = ~(uint)pbVar14 + (int)pbVar17;
          } while (pbVar14 < pbVar6);
          if ((uVar15 & 1) == 0) break;
        }
      }
      pbVar17 = pbVar17 + 1;
      pStream->zText = pbVar17;
    }
    pbVar17 = pStream->zText;
    (pToken->sData).nByte = (int)pbVar17 - (int)pbVar8;
    pToken->nType = 0x2000;
    goto LAB_00124e98;
  case 0x24:
    pToken->nType = 0x10;
    break;
  case 0x25:
  case 0x2a:
  case 0x2f:
switchD_001249b3_caseD_25:
    if ((pbVar8 < pbVar7) && (*pbVar8 == 0x3d)) {
LAB_00124b14:
      pbVar17 = pbVar17 + 2;
LAB_00124b18:
      pStream->zText = pbVar17;
    }
    break;
  case 0x26:
    pToken->nType = 0x200020;
    if ((pbVar8 < pbVar7) && ((*pbVar8 == 0x3d || (*pbVar8 == 0x26)))) {
      pToken->nType = 0x20;
      pStream->zText = pbVar17 + 2;
    }
  case 0x2e:
    pbVar17 = pStream->zText;
    if ((pbVar17 < pbVar7) && ((*pbVar17 == 0x3d || (*pbVar17 == 0x2e)))) {
      pStream->zText = pbVar17 + 1;
    }
    break;
  case 0x27:
    (pToken->sData).zString = (char *)pbVar8;
    pbVar17 = pStream->zText;
    if (pbVar17 < pbVar7) {
      do {
        if (*pbVar17 == 10) {
          pStream->nLine = pStream->nLine + 1;
        }
        else if (*pbVar17 == 0x27) {
          if (pbVar17[-1] != 0x5c) break;
          pbVar6 = pbVar17 + -2;
          if (pStream->zInput < pbVar6) {
            bVar18 = true;
            do {
              if (*pbVar6 != 0x5c) break;
              pbVar6 = pbVar6 + -1;
              bVar18 = (bool)(bVar18 ^ 1);
            } while (pStream->zInput < pbVar6);
            if (!bVar18) break;
          }
        }
        pbVar17 = pbVar17 + 1;
        pStream->zText = pbVar17;
      } while (pbVar17 != pbVar7);
    }
    (pToken->sData).nByte = (int)pbVar17 - (int)pbVar8;
    pToken->nType = 0x4000;
LAB_00124e98:
    pStream->zText = pbVar17 + 1;
LAB_00124c22:
    bVar18 = false;
    goto LAB_0012500e;
  case 0x28:
    pToken->nType = 0x200;
    break;
  case 0x29:
    pSVar1 = pStream->pSet;
    uVar16 = pSVar1->nUsed;
    if (uVar16 < 2) {
LAB_00124f15:
      pToken->nType = 0x400;
      break;
    }
    uVar10 = (ulong)((uVar16 - 1) * pSVar1->eSize);
    if ((((*(byte *)((long)pSVar1->pBase + uVar10 + 0x10) & 4) == 0) ||
        (uVar15 = *(uint *)((long)pSVar1->pBase + uVar10 + 0x18), (uVar15 & 0x78000) == 0)) ||
       ((*(byte *)((long)pSVar1->pBase + (ulong)(pSVar1->eSize * (uVar16 - 2)) + 0x11) & 2) == 0))
    goto LAB_00124f15;
    if ((uVar15 >> 0x11 & 1) == 0) {
      if ((short)uVar15 < 0) {
        zSrc = "(bool)";
      }
      else {
        zSrc = "(string)";
        if ((uVar15 >> 0x12 & 1) == 0) {
          zSrc = "(int)";
        }
      }
    }
    else {
      zSrc = "(float)";
    }
    pToken->nType = 0x20;
    (pToken->sData).zString = zSrc;
    sVar4 = SyStrlen(zSrc);
    (pToken->sData).nByte = sVar4;
    bVar18 = false;
    pjVar9 = jx9ExprExtractOperator(&pToken->sData,(SyToken *)0x0);
    pToken->pUserData = pjVar9;
    pSVar1->nUsed = uVar16 - 2;
    goto LAB_0012500e;
  case 0x2b:
    if ((pbVar8 < pbVar7) && ((*pbVar8 == 0x3d || (*pbVar8 == 0x2b)))) goto LAB_00124b14;
    break;
  case 0x2c:
    pToken->nType = 0x20020;
    break;
  case 0x2d:
    if ((pbVar8 < pbVar7) &&
       (((bVar12 = *pbVar8, bVar12 == 0x3e || (bVar12 == 0x3d)) || (bVar12 == 0x2d))))
    goto LAB_00124b14;
    break;
  case 0x3a:
    pToken->nType = 0x100000;
    break;
  case 0x3b:
    pToken->nType = 0x40000;
    break;
  case 0x3c:
    if (pbVar8 < pbVar7) {
      bVar12 = *pbVar8;
      if ((bVar12 == 0x3e) || (bVar12 == 0x3d)) goto LAB_00124b14;
      if (bVar12 == 0x3c) {
        pbVar8 = pbVar17 + 2;
        pStream->zText = pbVar8;
        if (pbVar8 < pbVar7) {
          if (*pbVar8 == 0x3c) {
            pStream->zText = pbVar17 + 3;
            sVar3 = LexExtractNowdoc(pStream,pToken);
            if (sVar3 != 0) break;
            goto LAB_00124c22;
          }
          if (*pbVar8 != 0x3d) break;
          goto LAB_00124c83;
        }
      }
    }
    break;
  case 0x3d:
    pToken->nType = 0x400020;
    if ((pbVar8 < pbVar7) && (*pbVar8 == 0x3d)) {
      pToken->nType = 0x20;
      goto LAB_00124c69;
    }
    break;
  case 0x3e:
    if (pbVar8 < pbVar7) {
      if (*pbVar8 == 0x3d) goto LAB_00124b14;
      if (*pbVar8 == 0x3e) goto LAB_00124c69;
    }
  }
switchD_001249b3_caseD_23:
  if ((pToken->sData).nByte == 0) {
    (pToken->sData).nByte = *(int *)&pStream->zText - *(int *)&(pToken->sData).zString;
  }
  uVar16 = pToken->nType;
  sVar3 = 0;
  bVar18 = true;
  if ((uVar16 & 0x20) != 0) {
    pSVar1 = pStream->pSet;
    if (pSVar1->nUsed == 0) {
      pLast = (SyToken *)0x0;
    }
    else {
      pLast = (SyToken *)((ulong)((pSVar1->nUsed - 1) * pSVar1->eSize) + (long)pSVar1->pBase);
    }
    pjVar9 = jx9ExprExtractOperator(&pToken->sData,pLast);
    bVar18 = true;
    if (pjVar9 == (jx9_expr_op *)0x0) {
      uVar16 = uVar16 & 0xffffffdf;
      sVar4 = 0x1000000;
      if (uVar16 != 0) {
        sVar4 = uVar16;
      }
      pToken->nType = sVar4;
    }
    else {
      pToken->pUserData = pjVar9;
    }
LAB_0012500e:
    sVar3 = 0;
  }
LAB_00125010:
  if (bVar18) {
LAB_00125015:
    sVar3 = 0;
  }
  return sVar3;
LAB_001247a1:
  uVar15 = (int)pbVar8 - (int)pbVar17;
  (pToken->sData).nByte = uVar15;
  uVar16 = 8;
  if ((1 < (int)uVar15) &&
     (uVar2 = (int)((int)(char)*pbVar17 << 2 ^ uVar15 ^
                   (char)pbVar17[(ulong)(uVar15 & 0x7fffffff) - 1] * 3) % 0x3b,
     (0x7d9b967832231afU >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
    pbVar7 = keywordCode_aHash + (int)uVar2;
    do {
      uVar10 = (ulong)(*pbVar7 - 1);
      if (((byte)keywordCode_aLen[uVar10] == uVar15) &&
         (sVar3 = SyMemcmp("printegereturnconstaticaselseifloatincludefaultDIEXITcontinuediewhileASPRINTbooleanbreakforeachfunctionimportstringswitchuplink"
                           + *(ushort *)(keywordCode_aOffset + uVar10 * 2),pbVar17,uVar15),
         sVar3 == 0)) {
        uVar16 = *(uint *)(keywordCode_aCode + uVar10 * 4);
        goto LAB_001248e8;
      }
      pbVar7 = keywordCode_aNext + uVar10;
    } while ((0x7cbffdffUL >> (uVar10 & 0x3f) & 1) == 0);
    uVar16 = 8;
  }
LAB_001248e8:
  if (uVar16 == 8) {
    pToken->nType = 8;
  }
  else {
    pToken->nType = 4;
    pToken->pUserData = (void *)(ulong)uVar16;
  }
  goto LAB_00125015;
}

Assistant:

static sxi32 jx9TokenizeInput(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)
{
	SyString *pStr;
	sxi32 rc;
	/* Ignore leading white spaces */
	while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisSpace(pStream->zText[0]) ){
		/* Advance the stream cursor */
		if( pStream->zText[0] == '\n' ){
			/* Update line counter */
			pStream->nLine++;
		}
		pStream->zText++;
	}
	if( pStream->zText >= pStream->zEnd ){
		/* End of input reached */
		return SXERR_EOF;
	}
	/* Record token starting position and line */
	pToken->nLine = pStream->nLine;
	pToken->pUserData = 0;
	pStr = &pToken->sData;
	SyStringInitFromBuf(pStr, pStream->zText, 0);
	if( pStream->zText[0] >= 0xc0 || SyisAlpha(pStream->zText[0]) || pStream->zText[0] == '_' ){
		/* The following code fragment is taken verbatim from the xPP source tree.
		 * xPP is a modern embeddable macro processor with advanced features useful for
		 * application seeking for a production quality, ready to use macro processor.
		 * xPP is a widely used library developed and maintened by Symisc Systems.
		 * You can reach the xPP home page by following this link:
		 * http://xpp.symisc.net/
		 */
		const unsigned char *zIn;
		sxu32 nKeyword;
		/* Isolate UTF-8 or alphanumeric stream */
		if( pStream->zText[0] < 0xc0 ){
			pStream->zText++;
		}
		for(;;){
			zIn = pStream->zText;
			if( zIn[0] >= 0xc0 ){
				zIn++;
				/* UTF-8 stream */
				while( zIn < pStream->zEnd && ((zIn[0] & 0xc0) == 0x80) ){
					zIn++;
				}
			}
			/* Skip alphanumeric stream */
			while( zIn < pStream->zEnd && zIn[0] < 0xc0 && (SyisAlphaNum(zIn[0]) || zIn[0] == '_') ){
				zIn++;
			}
			if( zIn == pStream->zText ){
				/* Not an UTF-8 or alphanumeric stream */
				break;
			}
			/* Synchronize pointers */
			pStream->zText = zIn;
		}
		/* Record token length */
		pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		nKeyword = keywordCode(pStr->zString, (int)pStr->nByte);
		if( nKeyword != JX9_TK_ID ){
			/* We are dealing with a keyword [i.e: if, function, CREATE, ...], save the keyword ID */
			pToken->nType = JX9_TK_KEYWORD;
			pToken->pUserData = SX_INT_TO_PTR(nKeyword);
		}else{
			/* A simple identifier */
			pToken->nType = JX9_TK_ID;
		}
	}else{
		sxi32 c;
		/* Non-alpha stream */
		if( pStream->zText[0] == '#' || 
			( pStream->zText[0] == '/' &&  &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '/') ){
				pStream->zText++;
				/* Inline comments */
				while( pStream->zText < pStream->zEnd && pStream->zText[0] != '\n' ){
					pStream->zText++;
				}
				/* Tell the upper-layer to ignore this token */ 
				return SXERR_CONTINUE;
		}else if( pStream->zText[0] == '/' && &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '*' ){
			pStream->zText += 2;
			/* Block comment */
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '*' ){
					if( &pStream->zText[1] >= pStream->zEnd || pStream->zText[1] == '/'  ){
						break;
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			pStream->zText += 2;
			/* Tell the upper-layer to ignore this token */
			return SXERR_CONTINUE;
		}else if( SyisDigit(pStream->zText[0]) ){
			pStream->zText++;
			/* Decimal digit stream */
			while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
				pStream->zText++;
			}
			/* Mark the token as integer until we encounter a real number */
			pToken->nType = JX9_TK_INTEGER;
			if( pStream->zText < pStream->zEnd ){
				c = pStream->zText[0];
				if( c == '.' ){
					/* Real number */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
						pStream->zText++;
					}
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c=='e' || c=='E' ){
							pStream->zText++;
							if( pStream->zText < pStream->zEnd ){
								c = pStream->zText[0];
								if( (c =='+' || c=='-') && &pStream->zText[1] < pStream->zEnd  &&
									pStream->zText[1] < 0xc0 && SyisDigit(pStream->zText[1]) ){
										pStream->zText++;
								}
								while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
									pStream->zText++;
								}
							}
						}
					}
					pToken->nType = JX9_TK_REAL;
				}else if( c=='e' || c=='E' ){
					SXUNUSED(pUserData); /* Prevent compiler warning */
					SXUNUSED(pCtxData);
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( (c =='+' || c=='-') && &pStream->zText[1] < pStream->zEnd  &&
							pStream->zText[1] < 0xc0 && SyisDigit(pStream->zText[1]) ){
								pStream->zText++;
						}
						while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
							pStream->zText++;
						}
					}
					pToken->nType = JX9_TK_REAL;
				}else if( c == 'x' || c == 'X' ){
					/* Hex digit stream */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisHex(pStream->zText[0]) ){
						pStream->zText++;
					}
				}else if(c  == 'b' || c == 'B' ){
					/* Binary digit stream */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && (pStream->zText[0] == '0' || pStream->zText[0] == '1') ){
						pStream->zText++;
					}
				}
			}
			/* Record token length */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			return SXRET_OK;
		}
		c = pStream->zText[0];
		pStream->zText++; /* Advance the stream cursor */
		/* Assume we are dealing with an operator*/
		pToken->nType = JX9_TK_OP;
		switch(c){
		case '$': pToken->nType = JX9_TK_DOLLAR; break;
		case '{': pToken->nType = JX9_TK_OCB;   break; 
		case '}': pToken->nType = JX9_TK_CCB;    break;
		case '(': pToken->nType = JX9_TK_LPAREN; break; 
		case '[': pToken->nType |= JX9_TK_OSB;   break; /* Bitwise operation here, since the square bracket token '[' 
														 * is a potential operator [i.e: subscripting] */
		case ']': pToken->nType = JX9_TK_CSB;    break;
		case ')': {
			SySet *pTokSet = pStream->pSet;
			/* Assemble type cast operators [i.e: (int), (float), (bool)...] */ 
			if( pTokSet->nUsed >= 2 ){
				SyToken *pTmp;
				/* Peek the last recongnized token */
				pTmp = (SyToken *)SySetPeek(pTokSet);
				if( pTmp->nType & JX9_TK_KEYWORD ){
					sxi32 nID = SX_PTR_TO_INT(pTmp->pUserData);
					if( (sxu32)nID & (JX9_TKWRD_INT|JX9_TKWRD_FLOAT|JX9_TKWRD_STRING|JX9_TKWRD_BOOL) ){
						pTmp = (SyToken *)SySetAt(pTokSet, pTokSet->nUsed - 2);
						if( pTmp->nType & JX9_TK_LPAREN ){
							/* Merge the three tokens '(' 'TYPE' ')' into a single one */
							const char * zTypeCast = "(int)";
							if( nID & JX9_TKWRD_FLOAT ){
								zTypeCast = "(float)";
							}else if( nID & JX9_TKWRD_BOOL ){
								zTypeCast = "(bool)";
							}else if( nID & JX9_TKWRD_STRING ){
								zTypeCast = "(string)";
							}
							/* Reflect the change */
							pToken->nType = JX9_TK_OP;
							SyStringInitFromBuf(&pToken->sData, zTypeCast, SyStrlen(zTypeCast));
							/* Save the instance associated with the type cast operator */
							pToken->pUserData = (void *)jx9ExprExtractOperator(&pToken->sData, 0);
							/* Remove the two previous tokens */
							pTokSet->nUsed -= 2;
							return SXRET_OK;
						}
					}
				}
			}
			pToken->nType = JX9_TK_RPAREN;
			break;
				  }
		case '\'':{
			/* Single quoted string */
			pStr->zString++;
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '\''  ){
					if( pStream->zText[-1] != '\\' ){
						break;
					}else{
						const unsigned char *zPtr = &pStream->zText[-2];
						sxi32 i = 1;
						while( zPtr > pStream->zInput && zPtr[0] == '\\' ){
							zPtr--;
							i++;
						}
						if((i&1)==0){
							break;
						}
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			/* Record token length and type */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			pToken->nType = JX9_TK_SSTR;
			/* Jump the trailing single quote */
			pStream->zText++;
			return SXRET_OK;
				  }
		case '"':{
			sxi32 iNest;
			/* Double quoted string */
			pStr->zString++;
			while( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '{' && &pStream->zText[1] < pStream->zEnd && pStream->zText[1] == '$'){
					iNest = 1;
					pStream->zText++;
					/* TICKET 1433-40: Hnadle braces'{}' in double quoted string where everything is allowed */
					while(pStream->zText < pStream->zEnd ){
						if( pStream->zText[0] == '{' ){
							iNest++;
						}else if (pStream->zText[0] == '}' ){
							iNest--;
							if( iNest <= 0 ){
								pStream->zText++;
								break;
							}
						}else if( pStream->zText[0] == '\n' ){
							pStream->nLine++;
						}
						pStream->zText++;
					}
					if( pStream->zText >= pStream->zEnd ){
						break;
					}
				}
				if( pStream->zText[0] == '"' ){
					if( pStream->zText[-1] != '\\' ){
						break;
					}else{
						const unsigned char *zPtr = &pStream->zText[-2];
						sxi32 i = 1;
						while( zPtr > pStream->zInput && zPtr[0] == '\\' ){
							zPtr--;
							i++;
						}
						if((i&1)==0){
							break;
						}
					}
				}
				if( pStream->zText[0] == '\n' ){
					pStream->nLine++;
				}
				pStream->zText++;
			}
			/* Record token length and type */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
			pToken->nType = JX9_TK_DSTR;
			/* Jump the trailing quote */
			pStream->zText++;
			return SXRET_OK;
				  }
		case ':':
			pToken->nType = JX9_TK_COLON; /* Single colon */
			break;
		case ',': pToken->nType |= JX9_TK_COMMA;  break; /* Comma is also an operator */
		case ';': pToken->nType = JX9_TK_SEMI;   break;
			/* Handle combined operators [i.e: +=, ===, !=== ...] */
		case '=':
			pToken->nType |= JX9_TK_EQUAL;
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '=' ){
					pToken->nType &= ~JX9_TK_EQUAL;
					/* Current operator: == */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
						/* Current operator: === */
						pStream->zText++;
					}
				}
			}
			break;
		case '!':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: != */
				pStream->zText++;
				if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
					/* Current operator: !== */
					pStream->zText++;
				}
			}
			break;
		case '&':
			pToken->nType |= JX9_TK_AMPER;
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '&' ){
					pToken->nType &= ~JX9_TK_AMPER;
					/* Current operator: && */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					pToken->nType &= ~JX9_TK_AMPER;
					/* Current operator: &= */
					pStream->zText++;
				}
			}
		case '.':
			if( pStream->zText < pStream->zEnd && (pStream->zText[0] == '.' || pStream->zText[0] == '=') ){
				/* Concatenation operator: '..' or '.='  */
				pStream->zText++;
			}
			break;
		case '|':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '|' ){
					/* Current operator: || */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: |= */
					pStream->zText++;
				}
			}
			break;
		case '+':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '+' ){
					/* Current operator: ++ */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: += */
					pStream->zText++;
				}
			}
			break;
		case '-':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '-' ){
					/* Current operator: -- */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: -= */
					pStream->zText++;
				}else if( pStream->zText[0] == '>' ){
					/* Current operator: -> */
					pStream->zText++;
				}
			}
			break;
		case '*':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: *= */
				pStream->zText++;
			}
			break;
		case '/':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: /= */
				pStream->zText++;
			}
			break;
		case '%':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: %= */
				pStream->zText++;
			}
			break;
		case '^':
			if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
				/* Current operator: ^= */
				pStream->zText++;
			}
			break;
		case '<':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '<' ){
					/* Current operator: << */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						if( pStream->zText[0] == '=' ){
							/* Current operator: <<= */
							pStream->zText++;
						}else if( pStream->zText[0] == '<' ){
							/* Current Token: <<<  */
							pStream->zText++;
							/* This may be the beginning of a Heredoc/Nowdoc string, try to delimit it */
							rc = LexExtractNowdoc(&(*pStream), &(*pToken));
							if( rc == SXRET_OK ){
								/* Here/Now doc successfuly extracted */
								return SXRET_OK;
							}
						}
					}
				}else if( pStream->zText[0] == '>' ){
					/* Current operator: <> */
					pStream->zText++;
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: <= */
					pStream->zText++;
				}
			}
			break;
		case '>':
			if( pStream->zText < pStream->zEnd ){
				if( pStream->zText[0] == '>' ){
					/* Current operator: >> */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd && pStream->zText[0] == '=' ){
						/* Current operator: >>= */
						pStream->zText++;
					}
				}else if( pStream->zText[0] == '=' ){
					/* Current operator: >= */
					pStream->zText++;
				}
			}
			break;
		default:
			break;
		}
		if( pStr->nByte <= 0 ){
			/* Record token length */
			pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		}
		if( pToken->nType & JX9_TK_OP ){
			const jx9_expr_op *pOp;
			/* Check if the extracted token is an operator */
			pOp = jx9ExprExtractOperator(pStr, (SyToken *)SySetPeek(pStream->pSet));
			if( pOp == 0 ){
				/* Not an operator */
				pToken->nType &= ~JX9_TK_OP;
				if( pToken->nType <= 0 ){
					pToken->nType = JX9_TK_OTHER;
				}
			}else{
				/* Save the instance associated with this operator for later processing */
				pToken->pUserData = (void *)pOp;
			}
		}
	}
	/* Tell the upper-layer to save the extracted token for later processing */
	return SXRET_OK;
}